

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareWithFields
          (MessageDifferencer *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message1_fields_arg,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message2_fields_arg)

{
  pointer ppFVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  Metadata MVar6;
  Metadata MVar7;
  string_view str;
  string_view str_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message2_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message1_fields;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  parent_fields;
  StreamReporter reporter;
  StringOutputStream output_stream;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_b8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a0;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  local_88;
  StreamReporter local_68;
  StringOutputStream local_40;
  
  MVar6 = Message::GetMetadata(message1);
  MVar7 = Message::GetMetadata(message2);
  if (MVar6.descriptor == MVar7.descriptor) {
    local_88.
    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::clear(&(this->force_compare_no_presence_fields_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->force_compare_failure_triggering_fields_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector(&local_a0,
             ((long)(message1_fields_arg->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(message1_fields_arg->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_68
            );
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector(&local_b8,
             ((long)(message2_fields_arg->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(message2_fields_arg->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_68
            );
    ppFVar1 = (message1_fields_arg->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    sVar5 = (long)(message1_fields_arg->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
    if (sVar5 != 0) {
      memmove(local_a0.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start,ppFVar1,sVar5);
    }
    ppFVar1 = (message2_fields_arg->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    sVar5 = (long)(message2_fields_arg->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
    if (sVar5 != 0) {
      memmove(local_b8.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start,ppFVar1,sVar5);
    }
    ppFVar1 = local_a0.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)
     ((long)local_a0.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start +
     ((long)(message1_fields_arg->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish -
     (long)(message1_fields_arg->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_start)) = 0;
    *(undefined8 *)
     ((long)local_b8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start +
     ((long)(message2_fields_arg->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish -
     (long)(message2_fields_arg->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_start)) = 0;
    if (local_a0.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_a0.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar4 = (long)local_a0.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a0.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )local_a0.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )local_a0.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                  )0x2ceb98);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )ppFVar1,
                 (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )local_a0.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                  )0x2ceb98);
    }
    ppFVar1 = local_b8.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_b8.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b8.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar4 = (long)local_b8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )local_b8.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )local_b8.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                  )0x2ceb98);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
                ((__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )ppFVar1,
                 (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  )local_b8.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                  )0x2ceb98);
    }
    if (this->output_string_ == (string *)0x0) {
      bVar3 = CompareRequestedFieldsUsingSettings
                        (this,message1,message2,0,&local_a0,&local_b8,&local_88);
    }
    else {
      io::StringOutputStream::StringOutputStream(&local_40,this->output_string_);
      StreamReporter::StreamReporter(&local_68,&local_40.super_ZeroCopyOutputStream);
      this->reporter_ = &local_68.super_Reporter;
      bVar3 = CompareRequestedFieldsUsingSettings
                        (this,message1,message2,0,&local_a0,&local_b8,&local_88);
      this->reporter_ = (Reporter *)0x0;
      StreamReporter::~StreamReporter(&local_68);
    }
    if (local_b8.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (FieldDescriptor **)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a0.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (FieldDescriptor **)0x0) {
      operator_delete(local_a0.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.
        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
               ,0x233);
    str._M_str = "Comparison between two messages with different ";
    str._M_len = 0x2f;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_68,str);
    str_00._M_str = "descriptors.";
    str_00._M_len = 0xc;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_68,str_00);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_68);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MessageDifferencer::CompareWithFields(
    const Message& message1, const Message& message2,
    const std::vector<const FieldDescriptor*>& message1_fields_arg,
    const std::vector<const FieldDescriptor*>& message2_fields_arg) {
  if (message1.GetDescriptor() != message2.GetDescriptor()) {
    ABSL_DLOG(FATAL) << "Comparison between two messages with different "
                     << "descriptors.";
    return false;
  }

  std::vector<SpecificField> parent_fields;
  force_compare_no_presence_fields_.clear();
  force_compare_failure_triggering_fields_.clear();

  bool result = false;

  std::vector<const FieldDescriptor*> message1_fields(
      message1_fields_arg.size() + 1);
  std::vector<const FieldDescriptor*> message2_fields(
      message2_fields_arg.size() + 1);

  std::copy(message1_fields_arg.cbegin(), message1_fields_arg.cend(),
            message1_fields.begin());
  std::copy(message2_fields_arg.cbegin(), message2_fields_arg.cend(),
            message2_fields.begin());

  // Append sentinel values.
  message1_fields[message1_fields_arg.size()] = nullptr;
  message2_fields[message2_fields_arg.size()] = nullptr;

  std::sort(message1_fields.begin(), message1_fields.end(), FieldBefore);
  std::sort(message2_fields.begin(), message2_fields.end(), FieldBefore);

  // Setup the internal reporter if need be.
  if (output_string_) {
    io::StringOutputStream output_stream(output_string_);
    StreamReporter reporter(&output_stream);
    reporter_ = &reporter;
    result = CompareRequestedFieldsUsingSettings(
        message1, message2, false, message1_fields, message2_fields,
        &parent_fields);
    reporter_ = nullptr;
  } else {
    result = CompareRequestedFieldsUsingSettings(
        message1, message2, false, message1_fields, message2_fields,
        &parent_fields);
  }

  return result;
}